

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

DenseSetPair<llvm::DWARFDebugNames::Abbrev> * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
::InsertIntoBucketImpl<llvm::DWARFDebugNames::Abbrev>
          (DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
           *this,Abbrev *Key,Abbrev *Lookup,DenseSetPair<llvm::DWARFDebugNames::Abbrev> *TheBucket)

{
  int iVar1;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *pDVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  Abbrev *LHS;
  undefined1 local_50 [8];
  Abbrev EmptyKey;
  uint NumBuckets;
  uint NewNumEntries;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *TheBucket_local;
  Abbrev *Lookup_local;
  Abbrev *Key_local;
  DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
  *this_local;
  
  _NumBuckets = TheBucket;
  TheBucket_local = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)Lookup;
  Lookup_local = Key;
  Key_local = (Abbrev *)this;
  DebugEpochBase::incrementEpoch((DebugEpochBase *)this);
  uVar4 = getNumEntries(this);
  EmptyKey.Attributes.
  super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = uVar4 + 1;
  uVar4 = getNumBuckets(this);
  iVar1 = EmptyKey.Attributes.
          super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  EmptyKey.Attributes.
  super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = uVar4;
  if ((uint)(EmptyKey.Attributes.
             super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 2) < uVar4 * 3) {
    uVar5 = getNumTombstones(this);
    if (uVar4 - (iVar1 + uVar5) <=
        (uint)EmptyKey.Attributes.
              super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3) {
      grow(this,(uint)EmptyKey.Attributes.
                      super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      LookupBucketFor<llvm::DWARFDebugNames::Abbrev>
                (this,&TheBucket_local->key,
                 (DenseSetPair<llvm::DWARFDebugNames::Abbrev> **)&NumBuckets);
    }
  }
  else {
    grow(this,uVar4 << 1);
    LookupBucketFor<llvm::DWARFDebugNames::Abbrev>
              (this,&TheBucket_local->key,
               (DenseSetPair<llvm::DWARFDebugNames::Abbrev> **)&NumBuckets);
    EmptyKey.Attributes.
    super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = getNumBuckets(this);
  }
  if (_NumBuckets == (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)0x0) {
    __assert_fail("TheBucket",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                  ,0x22f,
                  "BucketT *llvm::DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>, llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>::InsertIntoBucketImpl(const KeyT &, const LookupKeyT &, BucketT *) [DerivedT = llvm::DenseMap<llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>, KeyT = llvm::DWARFDebugNames::Abbrev, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DWARFDebugNames::AbbrevMapInfo, BucketT = llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>, LookupKeyT = llvm::DWARFDebugNames::Abbrev]"
                 );
  }
  incrementNumEntries(this);
  getEmptyKey();
  LHS = detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>::getFirst(_NumBuckets);
  bVar3 = DWARFDebugNames::AbbrevMapInfo::isEqual(LHS,(Abbrev *)local_50);
  if (!bVar3) {
    decrementNumTombstones(this);
  }
  pDVar2 = _NumBuckets;
  DWARFDebugNames::Abbrev::~Abbrev((Abbrev *)local_50);
  return pDVar2;
}

Assistant:

BucketT *InsertIntoBucketImpl(const KeyT &Key, const LookupKeyT &Lookup,
                                BucketT *TheBucket) {
    incrementEpoch();

    // If the load of the hash table is more than 3/4, or if fewer than 1/8 of
    // the buckets are empty (meaning that many are filled with tombstones),
    // grow the table.
    //
    // The later case is tricky.  For example, if we had one empty bucket with
    // tons of tombstones, failing lookups (e.g. for insertion) would have to
    // probe almost the entire table until it found the empty bucket.  If the
    // table completely filled with tombstones, no lookup would ever succeed,
    // causing infinite loops in lookup.
    unsigned NewNumEntries = getNumEntries() + 1;
    unsigned NumBuckets = getNumBuckets();
    if (LLVM_UNLIKELY(NewNumEntries * 4 >= NumBuckets * 3)) {
      this->grow(NumBuckets * 2);
      LookupBucketFor(Lookup, TheBucket);
      NumBuckets = getNumBuckets();
    } else if (LLVM_UNLIKELY(NumBuckets-(NewNumEntries+getNumTombstones()) <=
                             NumBuckets/8)) {
      this->grow(NumBuckets);
      LookupBucketFor(Lookup, TheBucket);
    }
    assert(TheBucket);

    // Only update the state after we've grown our bucket space appropriately
    // so that when growing buckets we have self-consistent entry count.
    incrementNumEntries();

    // If we are writing over a tombstone, remember this.
    const KeyT EmptyKey = getEmptyKey();
    if (!KeyInfoT::isEqual(TheBucket->getFirst(), EmptyKey))
      decrementNumTombstones();

    return TheBucket;
  }